

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_goaway_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int iVar2;
  nghttp2_session *in_RSI;
  nghttp2_frame *in_RDI;
  int unaff_retaddr;
  int32_t unaff_retaddr_00;
  nghttp2_session *in_stack_00000008;
  int rv;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (*(int *)&(in_RSI->streams).mem == 0) {
    if ((((int)(in_RSI->streams).size < 1) ||
        (iVar1 = nghttp2_session_is_my_stream_id
                           ((nghttp2_session *)&in_RDI->hd,(int32_t)(in_RSI->streams).size),
        iVar1 != 0)) && ((int)(in_RSI->streams).size <= *(int *)((long)in_RDI + 0xb08))) {
      *(byte *)((long)in_RDI + 0xb75) = *(byte *)((long)in_RDI + 0xb75) | 8;
      *(int *)((long)in_RDI + 0xb08) = (int)(in_RSI->streams).size;
      iVar1 = session_call_on_frame_received
                        (in_RSI,(nghttp2_frame *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      iVar2 = nghttp2_is_fatal(iVar1);
      if (iVar2 == 0) {
        iVar1 = session_close_stream_on_goaway(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
      }
    }
    else {
      iVar1 = session_handle_invalid_connection
                        ((nghttp2_session *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (int)((ulong)in_RSI >> 0x20),
                         (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
  }
  else {
    iVar1 = session_handle_invalid_connection
                      ((nghttp2_session *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (int)((ulong)in_RSI >> 0x20),
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  return iVar1;
}

Assistant:

int nghttp2_session_on_goaway_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  int rv;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: stream_id != 0");
  }
  /* Spec says Endpoints MUST NOT increase the value they send in the
     last stream identifier. */
  if ((frame->goaway.last_stream_id > 0 &&
       !nghttp2_session_is_my_stream_id(session,
                                        frame->goaway.last_stream_id)) ||
      session->remote_last_stream_id < frame->goaway.last_stream_id) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: invalid last_stream_id");
  }

  session->goaway_flags |= NGHTTP2_GOAWAY_RECV;

  session->remote_last_stream_id = frame->goaway.last_stream_id;

  rv = session_call_on_frame_received(session, frame);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                        0);
}